

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  http_settings_s arg_settings;
  long port;
  int iVar1;
  char *pcVar2;
  code *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined2 uStack_30;
  undefined1 uStack_2e;
  undefined5 uStack_2d;
  undefined1 local_28 [8];
  long http_port_long_int;
  char *http_port;
  undefined1 local_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char default_http_port [5];
  
  cStack_c = '\0';
  cStack_b = '\0';
  cStack_a = '\0';
  default_http_port[0] = '\0';
  stack0xffffffffffffffef = 0x30303033;
  local_d = 0;
  http_port_long_int = (long)&http_port + 7;
  pcVar2 = getenv("RSHUTDOWN_TOKEN");
  if ((pcVar2 != (char *)0x0) && (pcVar2 = getenv("RSHUTDOWN_TOKEN"), *pcVar2 != '\0')) {
    pcVar2 = getenv("RSHUTDOWN_HTTP_PORT");
    if ((pcVar2 == (char *)0x0) || (pcVar2 = getenv("RSHUTDOWN_HTTP_PORT"), *pcVar2 == '\0')) {
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x22,"RSHUTDOWN_HTTP_PORT environment variable not set - using default port");
    }
    else {
      http_port_long_int = (long)getenv("RSHUTDOWN_HTTP_PORT");
      iVar1 = __isoc99_sscanf(http_port_long_int,"%ld",local_28);
      if (iVar1 != 1) {
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
                ,0x29,"RSHUTDOWN_HTTP_PORT set to invalid port number - exiting");
        return 1;
      }
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x2d,"RSHUTDOWN_HTTP_PORT environment variable set");
    }
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
            ,0x31,"Listening on port %s",http_port_long_int);
    port = http_port_long_int;
    memset(&local_a8,0,0x80);
    local_a8 = on_request;
    uStack_2e = 1;
    arg_settings.log = 1;
    arg_settings.timeout = (undefined1)uStack_30;
    arg_settings.ws_timeout = uStack_30._1_1_;
    arg_settings._123_5_ = uStack_2d;
    arg_settings.on_upgrade = (_func_void_http_s_ptr_char_ptr_size_t *)uStack_a0;
    arg_settings.on_request = on_request;
    arg_settings.on_response = (_func_void_http_s_ptr *)local_98;
    arg_settings.on_finish = (_func_void_http_settings_s_ptr *)uStack_90;
    arg_settings.udata = (void *)local_88;
    arg_settings.public_folder = (char *)uStack_80;
    arg_settings.public_folder_length = local_78;
    arg_settings.max_header_size = uStack_70;
    arg_settings.max_body_size = local_68;
    arg_settings.max_clients = uStack_60;
    arg_settings.tls = (void *)local_58;
    arg_settings.reserved1 = uStack_50;
    arg_settings.reserved2 = local_48;
    arg_settings.reserved3 = uStack_40;
    arg_settings.ws_max_msg_size = local_38;
    http_listen((char *)port,(char *)0x0,arg_settings);
    fio_start((fio_start_args)0x1);
    iVar1._0_1_ = cStack_c;
    iVar1._1_1_ = cStack_b;
    iVar1._2_1_ = cStack_a;
    iVar1._3_1_ = default_http_port[0];
    return iVar1;
  }
  log_log(4,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
          ,0x15,"RSHUTDOWN_TOKEN environment variable not set - exiting");
  return 1;
}

Assistant:

int main(void) {
  char default_http_port[] = "3000";
  char *http_port = default_http_port;
  long int http_port_long_int;

  /* check that RSHUTDOWN_TOKEN env var is set */
  if (getenv("RSHUTDOWN_TOKEN") == NULL || getenv("RSHUTDOWN_TOKEN")[0] == '\0') {
    log_error("RSHUTDOWN_TOKEN environment variable not set - exiting");
    return 1;
  }

  /* debug mode if compiled with NO_SHUTDOWN: display a message but don't shutdown */
#ifdef NO_SHUTDOWN
  log_info("NO_SHUTDOWN set - won't shutdown\n");
#endif

  /* use default port unless RSHUTDOWN_HTTP_PORT is set to another port */
  if (getenv("RSHUTDOWN_HTTP_PORT") == NULL
    || getenv("RSHUTDOWN_HTTP_PORT")[0] == '\0'
  ) {
    log_debug("RSHUTDOWN_HTTP_PORT environment variable not set - using default port");
  }
  else {
    http_port = getenv("RSHUTDOWN_HTTP_PORT");

    /* check if port is a valid number by attempting to convert it to a long int */
    if (sscanf(http_port, "%ld", &http_port_long_int) != 1) {
        log_error("RSHUTDOWN_HTTP_PORT set to invalid port number - exiting");
        return 1;
    }

    log_debug("RSHUTDOWN_HTTP_PORT environment variable set");
  }

  /* listen on any available network binding (NULL == 0.0.0.0) */
  log_info("Listening on port %s", http_port);
  http_listen(http_port, NULL, .on_request = on_request, .log = 1);

  /* start the server */
  fio_start(.threads = 1);
}